

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterized.cpp
# Opt level: O2

void __thiscall
iu_TestPCombine_x_iutest_x_TestA_Test::~iu_TestPCombine_x_iutest_x_TestA_Test
          (iu_TestPCombine_x_iutest_x_TestA_Test *this)

{
  this[-1].super_type.super_TestWithParam<std::tuple<bool,_int,_int>_>.super_Test.test_info_ =
       (TestInfo *)&PTR__Test_0023bb00;
  iutest::Test::Observer<void>::s_current = (Test *)0x0;
  return;
}

Assistant:

IUTEST_P(TestPCombine, TestA)
{
    bool b = ::iutest::tuples::get<0>(GetParam());
    int i1 = ::iutest::tuples::get<1>(GetParam());
    int i2 = ::iutest::tuples::get<2>(GetParam());
    IUTEST_SUCCEED() << b << ", " << i1 << ", " << i2;

#if !defined(IUTEST_USE_GTEST)
    IUTEST_EXPECT_EQ( b, GetParam<0>());
    IUTEST_EXPECT_EQ(i1, GetParam<1>());
    IUTEST_EXPECT_EQ(i2, GetParam<2>());
#endif
}